

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O2

uint get_memory(uint len,int type,uchar mid)

{
  uint uVar1;
  MemoryNode **ppMVar2;
  MemoryNode *pMVar3;
  MemoryNode *pMVar4;
  MemoryNode *pMVar5;
  MemoryNode **ppMVar6;
  uint uVar7;
  
  uVar7 = 0xffffffff;
  if (len == 0) {
    return 0xffffffff;
  }
  if (type == 0) {
    ppMVar2 = &data_free_memory_head;
    ppMVar6 = &data_used_memory_head;
  }
  else {
    if (type != 1) {
      pMVar5 = (MemoryNode *)0x0;
      pMVar3 = (MemoryNode *)0x0;
      goto LAB_00104648;
    }
    ppMVar2 = &code_free_memory_head;
    ppMVar6 = &code_used_memory_head;
  }
  pMVar5 = *ppMVar6;
  pMVar3 = *ppMVar2;
LAB_00104648:
  pMVar3 = find_memory(len,pMVar3);
  if (pMVar3 != (MemoryNode *)0x0) {
    uVar7 = pMVar3->address;
    pMVar4 = (MemoryNode *)operator_new(0x20);
    pMVar4->address = uVar7;
    pMVar4->size = len;
    pMVar4->mid = mid;
    pMVar5 = find_last_node(pMVar5);
    pMVar5->next = pMVar4;
    pMVar4->forward = pMVar5;
    pMVar4->next = (MemoryNode *)0x0;
    uVar1 = pMVar3->size - len;
    if (uVar1 == 0) {
      pMVar5 = pMVar3->forward;
      pMVar3 = pMVar3->next;
      pMVar5->next = pMVar3;
      pMVar3->forward = pMVar5;
    }
    else {
      pMVar3->address = len + uVar7;
      pMVar3->size = uVar1;
    }
  }
  return uVar7;
}

Assistant:

EXPORT unsigned get_memory(unsigned len, int type,unsigned char mid) {
	MemoryNode *used_head = nullptr,*free_head = nullptr;
	if (!len) return-1;
	init_get_head(type, free_head, used_head);
	MemoryNode* p = find_memory(len,free_head);
	if (p != nullptr) {
		/*创建新的节点并把节点插入使用的最后*/
		unsigned adr = p->address;
		MemoryNode* new_used = new MemoryNode;
		new_used->address = p->address;
		new_used->size = len;
		new_used->mid = mid;
		MemoryNode* used_node = find_last_node(used_head);
		used_node->next = new_used;
		new_used->forward = used_node;
		new_used->next = nullptr;
		/*空闲块地址加 大小减小*/
		if (p->size == len) { //大小相等则取下节点
			MemoryNode *p_forword = p->forward;
			MemoryNode *p_next = p->next;
			p_forword->next = p_next;
			p_next->forward = p_forword;
		}
		else {
			p->address += len;
			p->size -= len;
		}
		return adr;
	}else return -1;
}